

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<4>::rehash(InnerLeaf<4> *this,int hashPos)

{
  long lVar1;
  double dVar2;
  int iVar3;
  unsigned_long uVar4;
  pair<int,_int> pVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint64_t hash;
  ulong uVar12;
  int i;
  int local_40;
  int local_3c;
  double local_38;
  
  (this->occupation).occupation = 0;
  iVar3 = this->size;
  if (0 < (long)iVar3) {
    uVar9 = (this->occupation).occupation;
    lVar10 = 0;
    do {
      uVar11 = *(ulong *)((long)&(this->entries)._M_elems[0].key_.first + lVar10 * 2);
      uVar12 = uVar11 & 0xffffffff;
      uVar11 = uVar11 >> 0x20;
      uVar11 = ((uVar11 + 0x80c8963be3e4c2f3) * (uVar12 + 0xc8497d2a400d9551) >> 0x20 ^
               (uVar11 + 0x8a183895eeac1536) * (uVar12 + 0x42d8680e260ae5b)) >>
               ((char)hashPos * -6 + 0x30U & 0x3f);
      *(ulong *)((long)(this->hashes)._M_elems + lVar10) = uVar11 & 0xffff;
      uVar9 = uVar9 | 1L << (uVar11 >> 10 & 0x3f);
      lVar10 = lVar10 + 8;
    } while ((long)iVar3 * 8 != lVar10);
    (this->occupation).occupation = uVar9;
  }
  local_3c = 0;
  if (0 < this->size) {
    do {
      lVar10 = (long)local_3c;
      uVar9 = (this->hashes)._M_elems[lVar10];
      local_40 = (int)POPCOUNT((this->occupation).occupation >> ((byte)(uVar9 >> 10) & 0x3f)) + -1;
      if (local_3c < local_40) {
        uVar4 = (this->hashes)._M_elems[local_40];
        (this->hashes)._M_elems[local_40] = uVar9;
        (this->hashes)._M_elems[lVar10] = uVar4;
        dVar2 = (this->entries)._M_elems[local_40].value_;
        (this->entries)._M_elems[local_40].value_ = (this->entries)._M_elems[lVar10].value_;
        pVar5 = (this->entries)._M_elems[local_40].key_;
        (this->entries)._M_elems[local_40].key_ = (this->entries)._M_elems[lVar10].key_;
        (this->entries)._M_elems[lVar10].key_ = pVar5;
        (this->entries)._M_elems[lVar10].value_ = dVar2;
      }
      else {
        bVar6 = local_40 < local_3c;
        if (local_40 < local_3c) {
          if (uVar9 <= (this->hashes)._M_elems[local_40]) {
            lVar8 = (long)local_40;
            do {
              if (local_3c + -1 == (int)lVar8) goto LAB_0032e7c2;
              lVar1 = lVar8 + 1;
              lVar7 = lVar8 + 1;
              lVar8 = lVar1;
            } while (uVar9 <= (this->hashes)._M_elems[lVar7]);
            local_40 = (int)lVar1;
            bVar6 = lVar1 < lVar10;
          }
          if (bVar6) {
            local_38 = (this->entries)._M_elems[lVar10].value_;
            pVar5 = (this->entries)._M_elems[lVar10].key_;
            move_backward(this,&local_40,&local_3c);
            lVar10 = (long)local_40;
            (this->hashes)._M_elems[lVar10] = uVar9;
            (this->entries)._M_elems[lVar10].key_ = pVar5;
            (this->entries)._M_elems[lVar10].value_ = local_38;
          }
        }
LAB_0032e7c2:
        local_3c = local_3c + 1;
      }
    } while (local_3c < this->size);
  }
  return;
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }